

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O2

void __thiscall
chrono::ChPhysicsItem::AddVisualShapeFEA
          (ChPhysicsItem *this,shared_ptr<chrono::ChVisualShapeFEA> *shape)

{
  element_type *peVar1;
  shared_ptr<chrono::ChVisualModel> model;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChVisualShapeFEA,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  peVar1 = (this->vis_model_instance).
           super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    std::make_shared<chrono::ChVisualModel>();
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&local_50);
    AddVisualModel(this,(shared_ptr<chrono::ChVisualModel> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    peVar1 = (this->vis_model_instance).
             super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,(__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> *)peVar1);
  std::__shared_ptr<chrono::ChVisualShapeFEA,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &shape->super___shared_ptr<chrono::ChVisualShapeFEA,_(__gnu_cxx::_Lock_policy)2>);
  ChVisualModel::AddShapeFEA(local_50._M_ptr,(shared_ptr<chrono::ChVisualShapeFEA> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void ChPhysicsItem::AddVisualShapeFEA(std::shared_ptr<ChVisualShapeFEA> shape) {
    if (!vis_model_instance) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        AddVisualModel(model);
    }
    vis_model_instance->GetModel()->AddShapeFEA(shape);
}